

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O3

bool __thiscall Json::StyledWriter::isMultilineArray(StyledWriter *this,Value *value)

{
  bool bVar1;
  ArrayIndex AVar2;
  Value *pVVar3;
  byte bVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  
  AVar2 = Value::size(value);
  bVar8 = this->rightMargin_ <= AVar2 * 3;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&this->childValues_,
                    (this->childValues_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  if (AVar2 != 0 && !bVar8) {
    uVar5 = 1;
    do {
      pVVar3 = Value::operator[](value,uVar5 - 1);
      bVar8 = Value::isArray(pVVar3);
      if ((bVar8) || (bVar8 = Value::isObject(pVVar3), bVar8)) {
        bVar8 = Value::empty(pVVar3);
        bVar8 = !bVar8;
      }
      else {
        bVar8 = false;
      }
    } while ((uVar5 < AVar2) && (uVar5 = uVar5 + 1, !bVar8));
  }
  bVar1 = true;
  if (!bVar8) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&this->childValues_,(ulong)AVar2);
    this->addChildValues_ = true;
    uVar5 = AVar2 * 2 + 2;
    if (AVar2 == 0) {
      bVar4 = 0;
    }
    else {
      lVar6 = 8;
      uVar7 = 0;
      bVar4 = 0;
      do {
        pVVar3 = Value::operator[](value,(ArrayIndex)uVar7);
        bVar8 = hasCommentForValue(pVVar3);
        bVar4 = bVar4 | bVar8;
        pVVar3 = Value::operator[](value,(ArrayIndex)uVar7);
        writeValue(this,pVVar3);
        uVar5 = uVar5 + *(int *)((long)&(((this->childValues_).
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                        _M_p + lVar6);
        uVar7 = uVar7 + 1;
        lVar6 = lVar6 + 0x20;
      } while (AVar2 != uVar7);
    }
    this->addChildValues_ = false;
    bVar1 = (bool)(this->rightMargin_ <= uVar5 | bVar4);
  }
  return bVar1;
}

Assistant:

bool StyledWriter::isMultilineArray(const Value& value) {
  ArrayIndex const size = value.size();
  bool isMultiLine = size * 3 >= rightMargin_;
  childValues_.clear();
  for (ArrayIndex index = 0; index < size && !isMultiLine; ++index) {
    const Value& childValue = value[index];
    isMultiLine = ((childValue.isArray() || childValue.isObject()) &&
                   !childValue.empty());
  }
  if (!isMultiLine) // check if line length > max line length
  {
    childValues_.reserve(size);
    addChildValues_ = true;
    ArrayIndex lineLength = 4 + (size - 1) * 2; // '[ ' + ', '*n + ' ]'
    for (ArrayIndex index = 0; index < size; ++index) {
      if (hasCommentForValue(value[index])) {
        isMultiLine = true;
      }
      writeValue(value[index]);
      lineLength += static_cast<ArrayIndex>(childValues_[index].length());
    }
    addChildValues_ = false;
    isMultiLine = isMultiLine || lineLength >= rightMargin_;
  }
  return isMultiLine;
}